

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

Configuration * __thiscall Clasp::Cli::ClaspCliConfig::config(ClaspCliConfig *this,char *n)

{
  int iVar1;
  Configuration *pCVar2;
  
  if (n != (char *)0x0) {
    iVar1 = strcmp(n,"tester");
    if (iVar1 == 0) {
      if ((this->super_ClaspConfig).tester_ == (UserConfig *)0x0) {
        setAppOpt(this,0x49,'\0',"");
      }
      return (Configuration *)(this->super_ClaspConfig).tester_;
    }
  }
  pCVar2 = ClaspConfig::config(&this->super_ClaspConfig,n);
  return pCVar2;
}

Assistant:

Configuration* ClaspCliConfig::config(const char* n) {
	if (n && std::strcmp(n, "tester") == 0) {
		if (!testerConfig()) {
			setAppOpt(meta_tester, 0, "");
		}
		return testerConfig();
	}
	return ClaspConfig::config(n);
}